

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.cxx
# Opt level: O2

bool write_file(string *name,string *content,bool *append)

{
  char cVar1;
  ofstream outfile;
  ostream aoStack_228 [512];
  
  std::ofstream::ofstream(aoStack_228);
  std::ofstream::open((char *)aoStack_228,(_Ios_Openmode)(name->_M_dataplus)._M_p);
  cVar1 = std::__basic_file<char>::is_open();
  if (cVar1 != '\0') {
    std::operator<<(aoStack_228,(string *)content);
  }
  std::ofstream::~ofstream(aoStack_228);
  return (bool)cVar1;
}

Assistant:

bool write_file(
        const std::string &name, const std::string &content, const bool &append) {
    std::ofstream outfile;

    if (append)
        outfile.open(
                name.c_str(),
                std::ofstream::binary|
                std::ofstream::ate|
                std::ofstream::app
            );
    else
        outfile.open(name.c_str(), std::ofstream::binary);

    if (outfile.is_open()) {
        outfile << content;
        return true;
    }

    return false;
}